

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

void BadHash(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  uint32_t h;
  uint uVar2;
  
  pbVar1 = (byte *)((long)len + (long)key);
  for (; key < pbVar1; key = (void *)((long)key + 1)) {
    uVar2 = seed >> 3 ^ seed;
    seed = uVar2 << 5 ^ uVar2 ^ (uint)*key;
  }
  *(uint32_t *)out = seed;
  return;
}

Assistant:

void
BadHash(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t	  h = seed;
  const uint8_t  *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];

  while (data < end) {
    h ^= h >> 3;
    h ^= h << 5;
    h ^= *data++;
  }

  *(uint32_t *) out = h;
}